

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O0

void dynamic_suite::test_string(void)

{
  bool v;
  type local_208;
  char *msg;
  undefined1 local_1c8 [8];
  variable value;
  basic_string_view<char,_std::char_traits<char>_> local_190;
  undefined1 local_180 [8];
  iarchive in;
  char input [8];
  
  in.member.reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x226168706c6122;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_190,
             (char *)((long)&in.member.reader.stack.c.
                             super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                             ._M_impl + 0x10));
  trial::protocol::json::basic_iarchive<char>::basic_iarchive
            ((basic_iarchive<char> *)local_180,&local_190);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1c8);
  boost::archive::detail::interface_iarchive<trial::protocol::json::basic_iarchive<char>>::
  operator>>((interface_iarchive<trial::protocol::json::basic_iarchive<char>> *)local_180,
             (basic_variable<std::allocator<char>_> *)local_1c8);
  v = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::string>
                ((basic_variable<std::allocator<char>_> *)local_1c8);
  boost::detail::test_impl
            ("value.is<string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/iarchive_suite.cpp"
             ,0x2d2,"void dynamic_suite::test_string()",v);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::string>
            (&local_208,(basic_variable<std::allocator<char>_> *)local_1c8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[6]>
            ("value.value<string>()","\"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/iarchive_suite.cpp"
             ,0x2d3,"void dynamic_suite::test_string()",&local_208,"alpha");
  std::__cxx11::string::~string((string *)&local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1c8);
  trial::protocol::json::basic_iarchive<char>::~basic_iarchive((basic_iarchive<char> *)local_180);
  return;
}

Assistant:

void test_string()
{
    const char input[] = "\"alpha\"";
    json::iarchive in(input);
    variable value;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST(value.is<string>());
    TRIAL_PROTOCOL_TEST_EQUAL(value.value<string>(), "alpha");
}